

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_subset_format(bcf_hdr_t *hdr,bcf1_t *rec)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  bcf_fmt_t *pbVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint32_t uVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  uint8_t *ptr_start;
  uint8_t *puVar14;
  byte *pbVar15;
  uint8_t *__dest;
  
  if (hdr->keep_samples != (uint8_t *)0x0) {
    if (hdr->n[2] == 0) {
      *(uint *)&rec->field_0x14 = (uint)(byte)rec->field_0x14;
      (rec->indiv).l = 0;
    }
    else {
      pbVar15 = (byte *)(rec->indiv).s;
      iVar6 = (rec->d).m_fmt;
      if (iVar6 < (int)(uint)(byte)rec->field_0x14) {
        uVar3 = (byte)rec->field_0x14 - 1;
        uVar3 = (int)uVar3 >> 1 | uVar3;
        uVar3 = (int)uVar3 >> 2 | uVar3;
        uVar3 = (int)uVar3 >> 4 | uVar3;
        uVar3 = (int)uVar3 >> 8 | uVar3;
        uVar3 = (int)uVar3 >> 0x10 | uVar3;
        (rec->d).m_fmt = uVar3 + 1;
        pbVar4 = (bcf_fmt_t *)realloc((rec->d).fmt,(long)(int)uVar3 * 0x20 + 0x20);
        (rec->d).fmt = pbVar4;
        iVar6 = (rec->d).m_fmt;
      }
      if (0 < iVar6) {
        lVar5 = 0x1c;
        lVar8 = 0;
        do {
          puVar1 = (uint *)((long)&((rec->d).fmt)->id + lVar5);
          *puVar1 = *puVar1 & 0x7fffffff;
          lVar8 = lVar8 + 1;
          lVar5 = lVar5 + 0x20;
        } while (lVar8 < (rec->d).m_fmt);
      }
      uVar9 = *(ulong *)&rec->field_0x10;
      if ((char)(uVar9 >> 0x20) != '\0') {
        pbVar4 = (rec->d).fmt;
        uVar11 = 0;
        __dest = (uint8_t *)0x0;
        do {
          if ((*pbVar15 & 0xf) == 2) {
            pbVar12 = pbVar15 + 3;
            iVar6 = (int)*(short *)(pbVar15 + 1);
          }
          else if ((*pbVar15 & 0xf) == 1) {
            pbVar12 = pbVar15 + 2;
            iVar6 = (int)(char)pbVar15[1];
          }
          else {
            pbVar12 = pbVar15 + 5;
            iVar6 = *(int *)(pbVar15 + 1);
          }
          pbVar4 = pbVar4 + uVar11;
          pbVar4->id = iVar6;
          bVar2 = *pbVar12;
          pbVar4->type = bVar2 & 0xf;
          if (*pbVar12 < 0xf0) {
            pbVar13 = pbVar12 + 1;
            uVar3 = (uint)(*pbVar12 >> 4);
          }
          else if ((pbVar12[1] & 0xf) == 2) {
            uVar3 = (uint)*(short *)(pbVar12 + 2);
            pbVar13 = pbVar12 + 4;
          }
          else if ((pbVar12[1] & 0xf) == 1) {
            uVar3 = (uint)(char)pbVar12[2];
            pbVar13 = pbVar12 + 3;
          }
          else {
            uVar3 = *(uint *)(pbVar12 + 2);
            pbVar13 = pbVar12 + 6;
          }
          pbVar4->n = uVar3;
          iVar6 = uVar3 << (bcf_type_shift[bVar2 & 0xf] & 0x1f);
          pbVar4->size = iVar6;
          pbVar4->p = pbVar13;
          *(uint *)&pbVar4->field_0x1c = (int)pbVar13 - (int)pbVar15 & 0x7fffffff;
          uVar10 = iVar6 * (uint)(uVar9 >> 0x28);
          pbVar4->p_len = uVar10;
          pbVar4 = (rec->d).fmt;
          puVar14 = pbVar4[uVar11].p;
          iVar6 = pbVar4[uVar11].size;
          if (__dest != (uint8_t *)0x0) {
            uVar9 = (ulong)*(uint *)&pbVar4[uVar11].field_0x1c & 0x7fffffff;
            memmove(pbVar4[uVar11 - 1].p + pbVar4[uVar11 - 1].p_len,puVar14 + -uVar9,uVar9);
            pbVar4 = (rec->d).fmt;
            pbVar4[uVar11].p =
                 pbVar4[uVar11 - 1].p +
                 ((ulong)*(uint *)&pbVar4[uVar11].field_0x1c & 0x7fffffff) +
                 (ulong)pbVar4[uVar11 - 1].p_len;
          }
          __dest = pbVar4[uVar11].p;
          iVar7 = hdr->nsamples_ori;
          if (0 < iVar7) {
            puVar14 = puVar14 + -(long)iVar6;
            uVar3 = 0;
            do {
              puVar14 = puVar14 + pbVar4[uVar11].size;
              if ((hdr->keep_samples[uVar3 >> 3] >> (uVar3 & 7) & 1) != 0) {
                memmove(__dest,puVar14,(long)pbVar4[uVar11].size);
                pbVar4 = (rec->d).fmt;
                __dest = __dest + pbVar4[uVar11].size;
                iVar7 = hdr->nsamples_ori;
              }
              uVar3 = uVar3 + 1;
            } while ((int)uVar3 < iVar7);
          }
          puVar14 = pbVar4[uVar11].p;
          (rec->indiv).l =
               (size_t)(__dest + ((rec->indiv).l - (long)(puVar14 + pbVar4[uVar11].p_len)));
          pbVar15 = pbVar13 + (int)uVar10;
          pbVar4[uVar11].p_len = (int)__dest - (int)puVar14;
          uVar11 = uVar11 + 1;
          uVar9 = *(ulong *)&rec->field_0x10;
        } while (uVar11 < (uVar9 >> 0x20 & 0xff));
      }
      *(byte *)&rec->unpacked = (byte)rec->unpacked | 8;
      *(ulong *)&rec->field_0x10 = uVar9 & 0xffffffffff | (ulong)(uint)hdr->n[2] << 0x28;
    }
  }
  return 0;
}

Assistant:

int bcf_subset_format(const bcf_hdr_t *hdr, bcf1_t *rec)
{
    if ( !hdr->keep_samples ) return 0;
    if ( !bcf_hdr_nsamples(hdr) )
    {
        rec->indiv.l = rec->n_sample = 0;
        return 0;
    }

    int i, j;
    uint8_t *ptr = (uint8_t*)rec->indiv.s, *dst = NULL, *src;
    bcf_dec_t *dec = &rec->d;
    hts_expand(bcf_fmt_t, rec->n_fmt, dec->m_fmt, dec->fmt);
    for (i=0; i<dec->m_fmt; ++i) dec->fmt[i].p_free = 0;

    for (i=0; i<rec->n_fmt; i++)
    {
        ptr = bcf_unpack_fmt_core1(ptr, rec->n_sample, &dec->fmt[i]);
        src = dec->fmt[i].p - dec->fmt[i].size;
        if ( dst )
        {
            memmove(dec->fmt[i-1].p + dec->fmt[i-1].p_len, dec->fmt[i].p - dec->fmt[i].p_off, dec->fmt[i].p_off);
            dec->fmt[i].p = dec->fmt[i-1].p + dec->fmt[i-1].p_len + dec->fmt[i].p_off;
        }
        dst = dec->fmt[i].p;
        for (j=0; j<hdr->nsamples_ori; j++)
        {
            src += dec->fmt[i].size;
            if ( !bit_array_test(hdr->keep_samples,j) ) continue;
            memmove(dst, src, dec->fmt[i].size);
            dst += dec->fmt[i].size;
        }
        rec->indiv.l -= dec->fmt[i].p_len - (dst - dec->fmt[i].p);
        dec->fmt[i].p_len = dst - dec->fmt[i].p;
    }
    rec->unpacked |= BCF_UN_FMT;

    rec->n_sample = bcf_hdr_nsamples(hdr);
    return 0;
}